

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicMapReader.cpp
# Opt level: O3

void __thiscall
tiger::trains::convertors::json::DynamicMapReader::readEvent
          (DynamicMapReader *this,json *jevent,EventModel *event)

{
  EventType EVar1;
  const_reference pvVar2;
  char *key;
  int ret;
  EventType local_1c;
  
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)jevent,"tick");
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
            (pvVar2,(int *)&local_1c);
  models::EventModel::setTick(event,local_1c);
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)jevent,"type");
  nlohmann::detail::
  get_arithmetic_value<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
            (pvVar2,(int *)&local_1c);
  models::EventModel::setType(event,local_1c);
  EVar1 = models::EventModel::getType(event);
  switch(EVar1) {
  case TRAIN_COLLISION:
    key = "train";
    break;
  case HIJACKERS_ASSAULT:
    key = "hijackers_power";
    break;
  case PARASITES_ASSAULT:
    key = "parasites_power";
    break;
  case REFUGEES_ARRIVAL:
    key = "refugees_number";
    break;
  default:
    goto switchD_00143f54_default;
  }
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)jevent,key);
  nlohmann::detail::
  from_json<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_int,_0>
            (pvVar2,(int *)&local_1c);
  models::EventModel::setParametrs(event,local_1c);
switchD_00143f54_default:
  return;
}

Assistant:

void DynamicMapReader::readEvent(const nlohmann::json &jevent, models::EventModel *event)
{
    event->setTick(jevent["tick"]);
    event->setType(jevent["type"]);

    switch (event->getType())
    {
    case models::EventType::HIJACKERS_ASSAULT:
        event->setParametrs(jevent["hijackers_power"]);
        break;

    case models::EventType::PARASITES_ASSAULT:
        event->setParametrs(jevent["parasites_power"]);
        break;

    case models::EventType::REFUGEES_ARRIVAL:
        event->setParametrs(jevent["refugees_number"]);
        break;

    case models::EventType::TRAIN_COLLISION:
        event->setParametrs(jevent["train"]);
        break;

    default:
        break;
    }
}